

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::~Connector(Connector *this)

{
  self *this_00;
  LogStream *this_01;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_28,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x1e,DEBUG,"~Connector");
    this_00 = LogStream::operator<<(&local_ff8.m_impl.m_stream,"dtor[");
    this_01 = LogStream::operator<<(this_00,this);
    LogStream::operator<<(this_01,"]");
    Logger::~Logger(&local_ff8);
  }
  if ((this->m_channel)._M_t.
      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
      super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl == (Channel *)0x0) {
    std::_Function_base::~_Function_base(&(this->m_newConnectionCallback).super__Function_base);
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_channel);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&(this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
                super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  __assert_fail("!m_channel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                ,0x1f,"sznet::net::Connector::~Connector()");
}

Assistant:

Connector::~Connector()
{
	LOG_DEBUG << "dtor[" << this << "]";
	assert(!m_channel);
}